

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

bool duckdb::ParquetMultiFileInfo::ParseOption
               (ClientContext *context,string *original_key,Value *val,
               MultiFileOptions *file_options,BaseFileReaderOptions *base_options)

{
  bool bVar1;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *__x;
  const_reference column_value;
  _func_int **pp_Var2;
  BinderException *pBVar3;
  bool bVar4;
  ulong __n;
  allocator local_151;
  vector<duckdb::Value,_true> column_values;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  ParquetColumnDefinition local_f0;
  
  StringUtil::Lower((string *)&key,(string *)original_key);
  if (val->is_null == true) {
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_f0,"Cannot use NULL as argument to %s",(allocator *)&column_values);
    ::std::__cxx11::string::string((string *)&local_110,(string *)original_key);
    BinderException::BinderException<std::__cxx11::string>(pBVar3,(string *)&local_f0,&local_110);
    __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = ::std::operator==(&key,"compression");
  bVar4 = true;
  if (!bVar1) {
    bVar1 = ::std::operator==(&key,"binary_as_string");
    if (bVar1) {
      bVar1 = BooleanValue::Get(val);
      *(bool *)&base_options[1]._vptr_BaseFileReaderOptions = bVar1;
    }
    else {
      bVar1 = ::std::operator==(&key,"file_row_number");
      if (bVar1) {
        bVar1 = BooleanValue::Get(val);
        *(bool *)((long)&base_options[1]._vptr_BaseFileReaderOptions + 1) = bVar1;
      }
      else {
        bVar1 = ::std::operator==(&key,"debug_use_openssl");
        if (bVar1) {
          bVar1 = BooleanValue::Get(val);
          *(bool *)&base_options[4]._vptr_BaseFileReaderOptions = bVar1;
        }
        else {
          bVar1 = ::std::operator==(&key,"schema");
          if (bVar1) {
            ParquetScanFunction::VerifyParquetSchemaParameter(val);
            __x = &ListValue::GetChildren(val)->
                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&column_values,__x);
            if (column_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start ==
                column_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_f0,"Parquet schema cannot be empty",&local_151);
              BinderException::BinderException(pBVar3,(string *)&local_f0);
              __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            ::std::
            vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
            ::reserve((vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
                       *)(base_options + 5),
                      (long)column_values.
                            super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)column_values.
                            super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 6);
            for (__n = 0; __n < (ulong)((long)column_values.
                                              super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                              .
                                              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)column_values.
                                              super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                              .
                                              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 6);
                __n = __n + 1) {
              column_value = vector<duckdb::Value,_true>::get<true>(&column_values,__n);
              ParquetColumnDefinition::FromSchemaValue(&local_f0,context,column_value);
              ::std::
              vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
              ::emplace_back<duckdb::ParquetColumnDefinition>
                        ((vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
                          *)(base_options + 5),&local_f0);
              ParquetColumnDefinition::~ParquetColumnDefinition(&local_f0);
            }
            file_options->auto_detect_hive_partitioning = false;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&column_values);
          }
          else {
            bVar1 = ::std::operator==(&key,"explicit_cardinality");
            if (bVar1) {
              pp_Var2 = (_func_int **)UBigIntValue::Get(val);
              base_options[8]._vptr_BaseFileReaderOptions = pp_Var2;
            }
            else {
              bVar1 = ::std::operator==(&key,"encryption_config");
              if (bVar1) {
                ParquetEncryptionConfig::Create((ParquetEncryptionConfig *)&local_f0,context,val);
                shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator=
                          ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)(base_options + 2),
                           (shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)&local_f0);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0.name);
              }
              else {
                bVar4 = false;
              }
            }
          }
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&key);
  return bVar4;
}

Assistant:

bool ParquetMultiFileInfo::ParseOption(ClientContext &context, const string &original_key, const Value &val,
                                       MultiFileOptions &file_options, BaseFileReaderOptions &base_options) {
	auto &parquet_options = base_options.Cast<ParquetFileReaderOptions>();
	auto &options = parquet_options.options;
	auto key = StringUtil::Lower(original_key);
	if (val.IsNull()) {
		throw BinderException("Cannot use NULL as argument to %s", original_key);
	}
	if (key == "compression") {
		// COMPRESSION has no effect on parquet read.
		// These options are determined from the file.
		return true;
	}
	if (key == "binary_as_string") {
		options.binary_as_string = BooleanValue::Get(val);
		return true;
	}
	if (key == "file_row_number") {
		options.file_row_number = BooleanValue::Get(val);
		return true;
	}
	if (key == "debug_use_openssl") {
		options.debug_use_openssl = BooleanValue::Get(val);
		return true;
	}
	if (key == "schema") {
		// Argument is a map that defines the schema
		const auto &schema_value = val;
		ParquetScanFunction::VerifyParquetSchemaParameter(schema_value);
		const auto column_values = ListValue::GetChildren(schema_value);
		if (column_values.empty()) {
			throw BinderException("Parquet schema cannot be empty");
		}
		options.schema.reserve(column_values.size());
		for (idx_t i = 0; i < column_values.size(); i++) {
			options.schema.emplace_back(ParquetColumnDefinition::FromSchemaValue(context, column_values[i]));
		}
		file_options.auto_detect_hive_partitioning = false;
		return true;
	}
	if (key == "explicit_cardinality") {
		options.explicit_cardinality = UBigIntValue::Get(val);
		return true;
	}
	if (key == "encryption_config") {
		options.encryption_config = ParquetEncryptionConfig::Create(context, val);
		return true;
	}
	return false;
}